

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

OptionContext * __thiscall
Potassco::ProgramOptions::OptionContext::add(OptionContext *this,OptionGroup *options)

{
  bool bVar1;
  OptionGroup *pOVar2;
  OptionGroup *pOVar3;
  string *caption;
  reference this_00;
  reference this_01;
  DescriptionLevel *pDVar4;
  OptionGroup *in_RSI;
  OptionContext *in_RDI;
  option_iterator end;
  option_iterator it;
  SharedOptPtr *in_stack_00000090;
  size_t in_stack_00000098;
  size_t k;
  OptionGroup *in_stack_ffffffffffffff48;
  OptionGroup *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff60;
  OptionContext *in_stack_ffffffffffffff68;
  DescriptionLevel local_80;
  DescriptionLevel local_7c;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *local_78;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  local_70 [11];
  OptionGroup *local_18;
  OptionGroup *local_10;
  
  local_10 = in_RSI;
  OptionGroup::caption_abi_cxx11_(in_RSI);
  pOVar2 = (OptionGroup *)findGroupKey(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_18 = pOVar2;
  pOVar3 = (OptionGroup *)
           std::
           vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
           ::size(&in_RDI->groups_);
  if (pOVar3 <= pOVar2) {
    pOVar2 = (OptionGroup *)&in_RDI->groups_;
    local_18 = (OptionGroup *)
               std::
               vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
               ::size((vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                       *)pOVar2);
    caption = OptionGroup::caption_abi_cxx11_(local_10);
    OptionGroup::descLevel(local_10);
    OptionGroup::OptionGroup
              (pOVar2,caption,(DescriptionLevel)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    std::
    vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
    ::push_back((vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                 *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    OptionGroup::~OptionGroup(in_stack_ffffffffffffff50);
  }
  local_70[0]._M_current =
       (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
       OptionGroup::begin(in_stack_ffffffffffffff48);
  local_78 = (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
             OptionGroup::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 = local_18;
    __gnu_cxx::
    __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
    ::operator*(local_70);
    insertOption((OptionContext *)k,in_stack_00000098,in_stack_00000090);
    __gnu_cxx::
    __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
    ::operator++(local_70);
  }
  this_00 = std::
            vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
            ::operator[](&in_RDI->groups_,(size_type)local_18);
  local_7c = OptionGroup::descLevel(local_10);
  this_01 = std::
            vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
            ::operator[](&in_RDI->groups_,(size_type)local_18);
  local_80 = OptionGroup::descLevel(this_01);
  pDVar4 = std::min<Potassco::ProgramOptions::DescriptionLevel>(&local_7c,&local_80);
  OptionGroup::setDescriptionLevel(this_00,*pDVar4);
  return in_RDI;
}

Assistant:

OptionContext& OptionContext::add(const OptionGroup& options) {
	size_t k = findGroupKey(options.caption());
	if (k >= groups_.size()) {
		// add as new group
		k = groups_.size();
		groups_.push_back(OptionGroup(options.caption(), options.descLevel()));
	}
	for (option_iterator it = options.begin(), end = options.end(); it != end; ++it) {
		insertOption(k, *it);
	}
	groups_[k].setDescriptionLevel(std::min(options.descLevel(), groups_[k].descLevel()));
	return *this;
}